

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void tcg_gen_sar_mod_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_andi_i32_tricore(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),b,0x1f);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_sar_i32,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(a + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  return;
}

Assistant:

static void tcg_gen_sar_mod_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_andi_i32(tcg_ctx, t, b, 31);
    tcg_gen_sar_i32(tcg_ctx, d, a, t);
    tcg_temp_free_i32(tcg_ctx, t);
}